

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall gutil::Properties::load(Properties *this,istream *in,char *name)

{
  byte bVar1;
  string *message;
  long lVar2;
  undefined8 uVar3;
  IOException *in_RDX;
  istream *in_RSI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  failure *ex;
  string value;
  string key;
  size_t pos;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe20;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator *paVar5;
  string *in_stack_fffffffffffffe80;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  long local_78;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [48];
  string local_38 [32];
  IOException *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  std::ios::exceptions((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_6a = 1;
    message = (string *)__cxa_allocate_exception(0x28);
    paVar5 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,(char *)local_18,paVar5);
    IOException::IOException(local_18,message);
    local_6a = 0;
    __cxa_throw(message,&IOException::typeinfo,IOException::~IOException);
  }
  while( true ) {
    do {
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        std::__cxx11::string::~string(local_38);
        return;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38);
      trim(in_stack_fffffffffffffe80);
      local_78 = std::__cxx11::string::find((char)local_38,0x23);
      if (local_78 != -1) {
        std::__cxx11::string::substr((ulong)local_98,(ulong)local_38);
        std::__cxx11::string::operator=(local_38,local_98);
        std::__cxx11::string::~string(local_98);
      }
      lVar2 = std::__cxx11::string::size();
    } while (lVar2 == 0);
    local_78 = std::__cxx11::string::find((char)local_38,0x3d);
    if (local_78 == -1) break;
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_38);
    std::__cxx11::string::substr((ulong)local_d8,(ulong)local_38);
    trim(in_stack_fffffffffffffe80);
    trim(in_stack_fffffffffffffe80);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe40._M_node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe40 = _Var4.first._M_node;
    in_stack_fffffffffffffe3f = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b8);
  }
  uVar3 = __cxa_allocate_exception(0x28);
  std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  IOException::IOException((IOException *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  __cxa_throw(uVar3,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void Properties::load(std::istream &in, const char *name)
{
  std::string line;

  try
  {
    in.exceptions(std::ios_base::badbit);

    if (!in.good())
    {
      throw IOException(name);
    }

    while (in.good())
    {
      getline(in, line);

      trim(line);

      size_t pos=line.find('#');

      if (pos != line.npos)
      {
        line=line.substr(0, pos);
      }

      if (line.size() > 0)
      {
        pos=line.find('=');

        if (pos != line.npos)
        {
          std::string key=line.substr(0, pos);
          std::string value=line.substr(pos+1);

          trim(key);
          trim(value);

          data.insert(std::pair<std::string,std::string>(key, value));
        }
        else
        {
          throw IOException("Format <key>=<value> expected: "+line);
        }
      }
    }
  }
  catch (const std::ios_base::failure &ex)
  {
    throw IOException(ex.what());
  }
}